

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O2

ssize_t __thiscall
libtorrent::aux::part_file::read(part_file *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  iterator iVar3;
  ulong uVar4;
  int in_R8D;
  error_code *in_R9;
  error_code *ec;
  error_code eVar5;
  span<char> buf;
  file_handle f;
  unique_lock<std::mutex> l;
  piece_index_t piece_local;
  
  piece_local.m_val = (int)__nbytes;
  ec = in_R9;
  ::std::unique_lock<std::mutex>::unique_lock(&l,&this->m_mutex);
  iVar3 = ::std::
          _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_piece_map)._M_h,&piece_local);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    eVar5 = boost::system::errc::make_error_code(no_such_file_or_directory);
    in_R9->val_ = eVar5.val_;
    in_R9->failed_ = eVar5.failed_;
    *(int3 *)&in_R9->field_0x5 = eVar5._5_3_;
    in_R9->cat_ = eVar5.cat_;
    uVar4 = 0xffffffffffffffff;
  }
  else {
    iVar1 = *(int *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                           ._M_cur + 0xc);
    ::std::unique_lock<std::mutex>::unlock(&l);
    open_file((part_file *)&f,(open_mode_t)(uint)this,(error_code *)0x20);
    if (in_R9->failed_ == false) {
      buf.m_len = (long)in_R8D + (long)this->m_header_size + (long)this->m_piece_size * (long)iVar1;
      buf.m_ptr = (char *)__buf;
      uVar2 = pread_all((aux *)(ulong)(uint)f.m_fd,__fd,buf,(int64_t)in_R9,ec);
      uVar4 = (ulong)uVar2;
    }
    else {
      uVar4 = 0xffffffffffffffff;
    }
    file_handle::~file_handle(&f);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&l);
  return uVar4 & 0xffffffff;
}

Assistant:

int part_file::read(span<char> buf
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = make_error_code(boost::system::errc::no_such_file_or_directory);
			return -1;
		}

		slot_index_t const slot = i->second;
		l.unlock();

		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		return int(aux::pread_all(f.fd(), buf, slot_offset(slot) + offset, ec));
	}